

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_v_predictor_8x8_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined8 uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  ushort uVar5;
  ushort uVar6;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar21;
  ushort uVar22;
  __m128i inverted_weights;
  __m128i scale;
  __m128i weights;
  __m128i bottom_left;
  __m128i pred;
  __m128i pred_sum;
  __m128i weighted_px;
  undefined4 local_3ec;
  undefined8 local_358;
  undefined1 local_2d8;
  undefined1 uStack_2d7;
  undefined1 uStack_2d6;
  undefined1 uStack_2d5;
  undefined1 uStack_2d4;
  undefined1 uStack_2d3;
  undefined1 uStack_2d2;
  undefined1 uStack_2d1;
  undefined2 uStack_266;
  undefined2 uStack_264;
  undefined2 uStack_262;
  undefined2 uStack_25e;
  undefined2 uStack_25c;
  undefined2 uStack_25a;
  __m128i scaled_bottom_left_y;
  __m128i weights_y;
  __m128i y_select;
  undefined2 uStack_40;
  undefined2 uStack_3e;
  undefined2 uStack_3c;
  undefined2 uStack_3a;
  undefined2 uStack_36;
  int y_mask;
  __m128i top;
  __m128i round;
  __m128i scaled_bottom_left;
  
  bVar2 = *(byte *)(in_RCX + 7);
  uStack_266 = (ushort)bVar2;
  uStack_264 = (ushort)bVar2;
  uStack_262 = (ushort)bVar2;
  uStack_25e = (ushort)bVar2;
  uStack_25c = (ushort)bVar2;
  uStack_25a = (ushort)bVar2;
  uVar1 = *in_RDX;
  local_2d8 = (byte)uVar1;
  uStack_2d7 = (byte)((ulong)uVar1 >> 8);
  uStack_2d6 = (byte)((ulong)uVar1 >> 0x10);
  uStack_2d5 = (byte)((ulong)uVar1 >> 0x18);
  uStack_2d4 = (byte)((ulong)uVar1 >> 0x20);
  uStack_2d3 = (byte)((ulong)uVar1 >> 0x28);
  uStack_2d2 = (byte)((ulong)uVar1 >> 0x30);
  uStack_2d1 = (byte)((ulong)uVar1 >> 0x38);
  local_358 = in_RDI;
  for (local_3ec = 0x1000100; local_3ec < 0xf0e0f0f; local_3ec = local_3ec + 0x2020202) {
    auVar4._8_7_ = 0x20002500320049;
    auVar4._0_8_ = 0x69009200c500ff;
    auVar4[0xf] = 0;
    auVar7._8_8_ = CONCAT44(local_3ec,local_3ec);
    auVar7._0_8_ = CONCAT44(local_3ec,local_3ec);
    auVar7 = pshufb(auVar4,auVar7);
    auVar3._2_2_ = uStack_266 * 0x3b;
    auVar3._0_2_ = CONCAT11(0,bVar2);
    auVar3._4_2_ = uStack_264 * 0x6e;
    auVar3._6_2_ = uStack_262 * 0x97;
    auVar3._10_2_ = uStack_25e * 0xce;
    auVar3._8_2_ = CONCAT11(0,bVar2) * 0xb7;
    auVar3._12_2_ = uStack_25c * 0xdb;
    auVar3._14_2_ = uStack_25a * 0xe0;
    auVar8._8_8_ = CONCAT44(local_3ec,local_3ec);
    auVar8._0_8_ = CONCAT44(local_3ec,local_3ec);
    auVar8 = pshufb(auVar3,auVar8);
    uStack_36 = (ushort)uStack_2d7;
    y_mask._0_2_ = (ushort)uStack_2d6;
    y_mask._2_2_ = (ushort)uStack_2d5;
    top[0]._3_1_ = 0;
    top[0]._2_1_ = uStack_2d3;
    top[0]._5_1_ = 0;
    top[0]._4_1_ = uStack_2d2;
    top[0]._7_1_ = 0;
    top[0]._6_1_ = uStack_2d1;
    y_select[1]._0_2_ = auVar7._0_2_;
    y_select[1]._2_2_ = auVar7._2_2_;
    y_select[1]._4_2_ = auVar7._4_2_;
    y_select[1]._6_2_ = auVar7._6_2_;
    uStack_40 = auVar7._8_2_;
    uStack_3e = auVar7._10_2_;
    uStack_3c = auVar7._12_2_;
    uStack_3a = auVar7._14_2_;
    weights_y[1]._0_2_ = auVar8._0_2_;
    weights_y[1]._2_2_ = auVar8._2_2_;
    weights_y[1]._4_2_ = auVar8._4_2_;
    weights_y[1]._6_2_ = auVar8._6_2_;
    y_select[0]._0_2_ = auVar8._8_2_;
    y_select[0]._2_2_ = auVar8._10_2_;
    y_select[0]._4_2_ = auVar8._12_2_;
    y_select[0]._6_2_ = auVar8._14_2_;
    uVar5 = (short)weights_y[1] + (ushort)local_2d8 * (short)y_select[1] + 0x80;
    uVar9 = weights_y[1]._2_2_ + uStack_36 * y_select[1]._2_2_ + 0x80;
    uVar11 = weights_y[1]._4_2_ + (ushort)y_mask * y_select[1]._4_2_ + 0x80;
    uVar13 = weights_y[1]._6_2_ + y_mask._2_2_ * y_select[1]._6_2_ + 0x80;
    uVar15 = (short)y_select[0] + (ushort)uStack_2d4 * uStack_40 + 0x80;
    uVar17 = y_select[0]._2_2_ + top[0]._2_2_ * uStack_3e + 0x80;
    uVar19 = y_select[0]._4_2_ + top[0]._4_2_ * uStack_3c + 0x80;
    uVar21 = y_select[0]._6_2_ + top[0]._6_2_ * uStack_3a + 0x80;
    uVar6 = uVar5 >> 8;
    uVar10 = uVar9 >> 8;
    uVar12 = uVar11 >> 8;
    uVar14 = uVar13 >> 8;
    uVar16 = uVar15 >> 8;
    uVar18 = uVar17 >> 8;
    uVar20 = uVar19 >> 8;
    uVar22 = uVar21 >> 8;
    *local_358 = CONCAT17((uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar21 >> 8) - (0xff < uVar22),
                          CONCAT16((uVar20 != 0) * (uVar20 < 0x100) * (char)(uVar19 >> 8) -
                                   (0xff < uVar20),
                                   CONCAT15((uVar18 != 0) * (uVar18 < 0x100) * (char)(uVar17 >> 8) -
                                            (0xff < uVar18),
                                            CONCAT14((uVar16 != 0) * (uVar16 < 0x100) *
                                                     (char)(uVar15 >> 8) - (0xff < uVar16),
                                                     CONCAT13((uVar14 != 0) * (uVar14 < 0x100) *
                                                              (char)(uVar13 >> 8) - (0xff < uVar14),
                                                              CONCAT12((uVar12 != 0) *
                                                                       (uVar12 < 0x100) *
                                                                       (char)(uVar11 >> 8) -
                                                                       (0xff < uVar12),
                                                                       CONCAT11((uVar10 != 0) *
                                                                                (uVar10 < 0x100) *
                                                                                (char)(uVar9 >> 8) -
                                                                                (0xff < uVar10),
                                                                                (uVar6 != 0) *
                                                                                (uVar6 < 0x100) *
                                                                                (char)(uVar5 >> 8) -
                                                                                (0xff < uVar6)))))))
                         );
    local_358 = (undefined8 *)(in_RSI + (long)local_358);
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_8x8_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[7]);
  const __m128i weights = cvtepu8_epi16(LoadLo8(smooth_weights + 4));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_bottom_left =
      _mm_mullo_epi16(inverted_weights, bottom_left);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  const __m128i top = cvtepu8_epi16(LoadLo8(top_row));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left, y_select);
    write_smooth_directional_sum8(dst, &top, &weights_y, &scaled_bottom_left_y,
                                  &round);
    dst += stride;
  }
}